

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.h
# Opt level: O1

BSDF * __thiscall
pbrt::DiffuseTransmissionMaterial::GetBSDF<pbrt::UniversalTextureEvaluator>
          (undefined8 param_1,ulong param_2,BSDF *__return_storage_ptr__,
          DiffuseTransmissionMaterial *this,SampledWavelengths *param_5,int *param_6,
          undefined8 param_7,undefined8 param_8,undefined8 param_9,ulong param_10,
          undefined8 param_11,undefined8 param_12,undefined8 param_13,undefined8 param_14,
          undefined8 param_15,undefined8 param_16)

{
  undefined1 auVar1 [16];
  float fVar2;
  undefined8 uVar3;
  byte bVar4;
  TextureEvalContext ctx;
  TextureEvalContext ctx_00;
  TextureEvalContext ctx_01;
  byte bVar5;
  BSDF *pBVar6;
  undefined1 auVar7 [32];
  Float FVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar13 [56];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar18 [56];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  SampledSpectrum SVar19;
  undefined8 uVar20;
  UniversalTextureEvaluator local_d9;
  undefined1 local_d8 [8];
  Float FStack_d0;
  Float FStack_cc;
  BSDF *local_c0;
  undefined1 local_b8 [8];
  Float FStack_b0;
  Float FStack_ac;
  undefined1 auStack_a8 [16];
  BxDFHandle local_98;
  uintptr_t local_90;
  uintptr_t local_88;
  uintptr_t local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  
  auVar7 = _local_b8;
  local_b8._4_4_ = this->scale;
  local_b8._0_4_ = local_b8._4_4_;
  FStack_b0 = (Float)local_b8._4_4_;
  auStack_a8 = auVar7._16_16_;
  FStack_ac = (Float)local_b8._4_4_;
  local_80 = (this->reflectance).
             super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
             .bits;
  local_58 = *(undefined8 *)(param_5->lambda).values;
  uStack_50 = *(undefined8 *)((param_5->lambda).values + 2);
  uStack_48 = *(undefined8 *)(param_5->pdf).values;
  uStack_40 = *(undefined8 *)((param_5->pdf).values + 2);
  auVar13 = ZEXT856(param_10);
  auVar18 = ZEXT856(param_2);
  ctx._8_8_ = param_10;
  ctx.p.super_Tuple3<pbrt::Point3,_float>._0_8_ = param_9;
  ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>._4_8_ = param_11;
  ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>._0_8_ = param_12;
  ctx._32_8_ = param_13;
  ctx._40_8_ = param_14;
  ctx._48_8_ = param_15;
  ctx._56_8_ = param_16;
  local_c0 = __return_storage_ptr__;
  SVar19 = UniversalTextureEvaluator::operator()
                     (&local_d9,(SpectrumTextureHandle)&local_80,ctx,*param_5);
  auVar16._0_8_ = SVar19.values.values._8_8_;
  auVar16._8_56_ = auVar18;
  auVar11._0_8_ = SVar19.values.values._0_8_;
  auVar11._8_56_ = auVar13;
  auVar1 = vmovlhps_avx(auVar11._0_16_,auVar16._0_16_);
  auVar9._0_4_ = auVar1._0_4_ * (float)local_b8._0_4_;
  auVar9._4_4_ = auVar1._4_4_ * (float)local_b8._4_4_;
  auVar9._8_4_ = auVar1._8_4_ * FStack_b0;
  auVar9._12_4_ = auVar1._12_4_ * FStack_ac;
  auVar14._8_4_ = 0x3f800000;
  auVar14._0_8_ = 0x3f8000003f800000;
  auVar14._12_4_ = 0x3f800000;
  uVar3 = vcmpps_avx512vl(auVar9,ZEXT816(0) << 0x40,5);
  bVar5 = (byte)uVar3;
  auVar1 = vminps_avx(auVar14,auVar9);
  _local_b8 = ZEXT1632(auVar1);
  local_d8._4_4_ = this->scale;
  local_d8._0_4_ = local_d8._4_4_;
  FStack_d0 = (Float)local_d8._4_4_;
  FStack_cc = (Float)local_d8._4_4_;
  local_88 = (this->transmittance).
             super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
             .bits;
  uVar20 = *(undefined8 *)(param_5->lambda).values;
  uStack_70 = *(undefined8 *)((param_5->lambda).values + 2);
  uStack_68 = *(undefined8 *)(param_5->pdf).values;
  uStack_60 = *(undefined8 *)((param_5->pdf).values + 2);
  auVar13 = ZEXT856(param_10);
  auVar18 = ZEXT856(auVar14._8_8_);
  ctx_00._8_8_ = param_10;
  ctx_00.p.super_Tuple3<pbrt::Point3,_float>._0_8_ = param_9;
  ctx_00.dpdx.super_Tuple3<pbrt::Vector3,_float>._4_8_ = param_11;
  ctx_00.dpdy.super_Tuple3<pbrt::Vector3,_float>._0_8_ = param_12;
  ctx_00._32_8_ = param_13;
  ctx_00._40_8_ = param_14;
  ctx_00._48_8_ = param_15;
  ctx_00._56_8_ = param_16;
  local_78 = uVar20;
  SVar19 = UniversalTextureEvaluator::operator()
                     (&local_d9,(SpectrumTextureHandle)&local_88,ctx_00,*param_5);
  auVar17._0_8_ = SVar19.values.values._8_8_;
  auVar17._8_56_ = auVar18;
  auVar12._0_8_ = SVar19.values.values._0_8_;
  auVar12._8_56_ = auVar13;
  auVar1 = vmovlhps_avx(auVar12._0_16_,auVar17._0_16_);
  auVar10._0_4_ = auVar1._0_4_ * (float)local_d8._0_4_;
  auVar10._4_4_ = auVar1._4_4_ * (float)local_d8._4_4_;
  auVar10._8_4_ = auVar1._8_4_ * FStack_d0;
  auVar10._12_4_ = auVar1._12_4_ * FStack_cc;
  uVar3 = vcmpps_avx512vl(auVar10,_DAT_0045e4a0,5);
  auVar15._8_4_ = 0x3f800000;
  auVar15._0_8_ = 0x3f8000003f800000;
  auVar15._12_4_ = 0x3f800000;
  _local_d8 = vminps_avx(auVar15,auVar10);
  local_90 = (this->sigma).
             super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
             .bits;
  ctx_01._8_8_ = param_10;
  ctx_01.p.super_Tuple3<pbrt::Point3,_float>._0_8_ = param_9;
  ctx_01.dpdx.super_Tuple3<pbrt::Vector3,_float>._4_8_ = param_11;
  ctx_01.dpdy.super_Tuple3<pbrt::Vector3,_float>._0_8_ = param_12;
  ctx_01._32_8_ = param_13;
  ctx_01._40_8_ = param_14;
  ctx_01._48_8_ = param_15;
  ctx_01._56_8_ = param_16;
  FVar8 = UniversalTextureEvaluator::operator()(&local_d9,(FloatTextureHandle)&local_90,ctx_01);
  pBVar6 = local_c0;
  fVar2 = FVar8 * 0.017453292 * FVar8 * 0.017453292;
  bVar4 = bVar5 | (char)uVar3 << 4;
  auVar1._8_8_ = uVar20;
  auVar1._0_8_ = param_16;
  auVar7 = vinsertf32x4_avx512vl(_local_b8,auVar1,1);
  *param_6 = (uint)(bVar5 & 1) * auVar7._0_4_;
  param_6[1] = (uint)((bVar5 & 2) >> 1) * auVar7._4_4_;
  param_6[2] = (uint)((bVar5 & 4) >> 2) * auVar7._8_4_;
  param_6[3] = (uint)((bVar5 & 8) >> 3) * auVar7._12_4_;
  param_6[4] = (uint)(bVar4 >> 4 & 1) * auVar7._16_4_;
  param_6[5] = (uint)(bVar4 >> 5 & 1) * auVar7._20_4_;
  param_6[6] = (uint)(bVar4 >> 6 & 1) * auVar7._24_4_;
  param_6[7] = (uint)(bVar4 >> 7) * auVar7._28_4_;
  param_6[8] = (int)(1.0 - fVar2 / (fVar2 + 0.33 + fVar2 + 0.33));
  param_6[9] = (int)((fVar2 * 0.45) / (fVar2 + 0.09));
  local_98.
  super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
  .bits = (TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
           )((ulong)param_6 | 0x2000000000000);
  BSDF::BSDF(local_c0,(Vector3f *)&stack0x00000048,(Normal3f *)&stack0x00000054,
             (Normal3f *)&stack0x00000060,(Vector3f *)&stack0x0000006c,&local_98,1.0);
  return pBVar6;
}

Assistant:

PBRT_CPU_GPU BSDF GetBSDF(TextureEvaluator texEval, MaterialEvalContext ctx,
                              SampledWavelengths &lambda, DiffuseBxDF *bxdf) const {
        SampledSpectrum r = Clamp(scale * texEval(reflectance, ctx, lambda), 0, 1);
        SampledSpectrum t = Clamp(scale * texEval(transmittance, ctx, lambda), 0, 1);
        Float s = texEval(sigma, ctx);
        *bxdf = DiffuseBxDF(r, t, s);
        return BSDF(ctx.wo, ctx.n, ctx.ns, ctx.dpdus, bxdf);
    }